

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  GPUShaderFP64Test1 *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  char *__s;
  size_t sVar2;
  long lVar3;
  GLint GVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  GPUShaderFP64Test1 *this_01;
  _uniform_function func;
  bool bVar7;
  GLint nondouble_uniform_locations [16];
  double double_data [16];
  long local_290;
  GLint local_288 [4];
  GLint local_278;
  GLint local_274;
  GLint local_270;
  GLint local_26c;
  GLint local_268;
  GLint local_264;
  GLint local_260;
  GLint local_25c;
  GLint local_258;
  GLint local_254;
  GLint local_250;
  GLint local_24c;
  GPUShaderFP64Test1 *local_240;
  undefined8 local_238 [17];
  undefined1 auStack_1b0 [120];
  ios_base aiStack_138 [264];
  
  puVar5 = &DAT_01a3b3e0;
  puVar6 = local_238;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + 1;
    puVar6 = puVar6 + 1;
  }
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_288[0] = this->m_po_bool_uniform_location;
  local_288[1] = this->m_po_bvec2_uniform_location;
  local_288[2] = this->m_po_bvec3_uniform_location;
  local_288[3] = this->m_po_bvec4_uniform_location;
  local_278 = this->m_po_float_uniform_location;
  local_274 = this->m_po_int_uniform_location;
  local_270 = this->m_po_ivec2_uniform_location;
  local_26c = this->m_po_ivec3_uniform_location;
  local_268 = this->m_po_ivec4_uniform_location;
  local_264 = this->m_po_uint_uniform_location;
  local_260 = this->m_po_uvec2_uniform_location;
  local_25c = this->m_po_uvec3_uniform_location;
  local_258 = this->m_po_uvec4_uniform_location;
  local_254 = this->m_po_vec2_uniform_location;
  local_250 = this->m_po_vec3_uniform_location;
  local_24c = this->m_po_vec4_uniform_location;
  local_240 = this;
  (**(code **)(lVar3 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xbf6);
  this_00 = (GPUShaderFP64Test1 *)(auStack_1b0 + 8);
  bVar7 = true;
  local_290 = 0;
  GVar4 = local_288[0];
  while( true ) {
    func = UNIFORM_FUNCTION_1D;
    (**(code **)(lVar3 + 0x14d0))(0,GVar4);
    while( true ) {
      iVar1 = (**(code **)(lVar3 + 0x800))();
      if (iVar1 != 0x502) {
        auStack_1b0._0_8_ =
             ((local_240->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_01 = this_00;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        __s = getUniformFunctionString(this_01,func);
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible type."
                   ,0x67);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)auStack_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        std::ios_base::~ios_base(aiStack_138);
        bVar7 = false;
      }
      func = func + UNIFORM_FUNCTION_1DV;
      if (func == UNIFORM_FUNCTION_COUNT) break;
      (**(code **)(lVar3 + 0x14d8))(GVar4,1,local_238);
    }
    local_290 = local_290 + 1;
    if (local_290 == 0x10) break;
    GVar4 = local_288[local_290];
  }
  return bVar7;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const glw::GLint nondouble_uniform_locations[] = { m_po_bool_uniform_location,  m_po_bvec2_uniform_location,
													   m_po_bvec3_uniform_location, m_po_bvec4_uniform_location,
													   m_po_float_uniform_location, m_po_int_uniform_location,
													   m_po_ivec2_uniform_location, m_po_ivec3_uniform_location,
													   m_po_ivec4_uniform_location, m_po_uint_uniform_location,
													   m_po_uvec2_uniform_location, m_po_uvec3_uniform_location,
													   m_po_uvec4_uniform_location, m_po_vec2_uniform_location,
													   m_po_vec3_uniform_location,  m_po_vec4_uniform_location };
	const unsigned int n_nondouble_uniform_locations =
		sizeof(nondouble_uniform_locations) / sizeof(nondouble_uniform_locations[0]);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_nondouble_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = nondouble_uniform_locations[n_uniform_location];

		for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST);
			 function < static_cast<int>(UNIFORM_FUNCTION_COUNT); ++function)
		{
			switch (static_cast<_uniform_function>(function))
			{
			case UNIFORM_FUNCTION_1D:
				gl.uniform1d(uniform_location, 0.0);
				break;
			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_2D:
				gl.uniform2d(uniform_location, 0.0, 1.0);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_3D:
				gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_4D:
				gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1, double_data);
				break;

			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;

			default:
			{
				DE_ASSERT(false);
			}
			} /* switch (function) */

			error_code = gl.getError();
			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << getUniformFunctionString(static_cast<_uniform_function>(function))
								   << "() function did not generate GL_INVALID_OPERATION error when called for"
									  " a uniform of incompatible type."
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	} /* for (all checks) */

	return result;
}